

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcInfoTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::RenderTargetInfoCase::iterate(RenderTargetInfoCase *this)

{
  TestLog *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  string *psVar4;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  allocator<char> local_78b;
  allocator<char> local_78a;
  allocator<char> local_789;
  allocator<char> local_788;
  allocator<char> local_787;
  allocator<char> local_786;
  allocator<char> local_785;
  allocator<char> local_784;
  allocator<char> local_783;
  allocator<char> local_782;
  allocator<char> local_781;
  allocator<char> local_780;
  allocator<char> local_77f;
  allocator<char> local_77e;
  allocator<char> local_77d;
  allocator<char> local_77c;
  allocator<char> local_77b;
  allocator<char> local_77a;
  allocator<char> local_779;
  allocator<char> local_778;
  allocator<char> local_777;
  allocator<char> local_776;
  allocator<char> local_775;
  allocator<char> local_774;
  allocator<char> local_773;
  allocator<char> local_772;
  allocator<char> local_771;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  LogNumber<long> local_410;
  LogNumber<long> local_3a0;
  LogNumber<long> local_330;
  LogNumber<long> local_2c0;
  LogNumber<long> local_250;
  LogNumber<long> local_1e0;
  LogNumber<long> local_170;
  LogNumber<long> local_100;
  LogNumber<long> local_90;
  int *piVar3;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar3 = (int *)CONCAT44(extraout_var,iVar2);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"Width",&local_771);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"Width",&local_772);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"px",&local_773);
  psVar4 = &local_470;
  tcu::LogNumber<long>::LogNumber
            (&local_90,&local_430,&local_450,psVar4,QP_KEY_TAG_NONE,(long)*piVar3);
  iVar2 = (int)pTVar1;
  tcu::LogNumber<long>::write(&local_90,iVar2,__buf,(size_t)psVar4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"Height",&local_774);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,"Height",&local_775);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"px",&local_776);
  psVar4 = &local_4d0;
  tcu::LogNumber<long>::LogNumber
            (&local_100,&local_490,&local_4b0,psVar4,QP_KEY_TAG_NONE,(long)piVar3[1]);
  tcu::LogNumber<long>::write(&local_100,iVar2,__buf_00,(size_t)psVar4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"RedBits",&local_777);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_510,"Red bits",&local_778);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,glcts::fixed_sample_locations_values + 1,&local_779);
  psVar4 = &local_530;
  tcu::LogNumber<long>::LogNumber
            (&local_170,&local_4f0,&local_510,psVar4,QP_KEY_TAG_NONE,(long)piVar3[2]);
  tcu::LogNumber<long>::write(&local_170,iVar2,__buf_01,(size_t)psVar4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_550,"GreenBits",&local_77a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"Green bits",&local_77b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_590,glcts::fixed_sample_locations_values + 1,&local_77c);
  psVar4 = &local_590;
  tcu::LogNumber<long>::LogNumber
            (&local_1e0,&local_550,&local_570,psVar4,QP_KEY_TAG_NONE,(long)piVar3[3]);
  tcu::LogNumber<long>::write(&local_1e0,iVar2,__buf_02,(size_t)psVar4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b0,"BlueBits",&local_77d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"Blue bits",&local_77e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,glcts::fixed_sample_locations_values + 1,&local_77f);
  psVar4 = &local_5f0;
  tcu::LogNumber<long>::LogNumber
            (&local_250,&local_5b0,&local_5d0,psVar4,QP_KEY_TAG_NONE,(long)piVar3[4]);
  tcu::LogNumber<long>::write(&local_250,iVar2,__buf_03,(size_t)psVar4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_610,"AlphaBits",&local_780);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,"Alpha bits",&local_781);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_650,glcts::fixed_sample_locations_values + 1,&local_782);
  psVar4 = &local_650;
  tcu::LogNumber<long>::LogNumber
            (&local_2c0,&local_610,&local_630,psVar4,QP_KEY_TAG_NONE,(long)piVar3[5]);
  tcu::LogNumber<long>::write(&local_2c0,iVar2,__buf_04,(size_t)psVar4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_670,"DepthBits",&local_783);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"Depth bits",&local_784);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b0,glcts::fixed_sample_locations_values + 1,&local_785);
  psVar4 = &local_6b0;
  tcu::LogNumber<long>::LogNumber
            (&local_330,&local_670,&local_690,psVar4,QP_KEY_TAG_NONE,(long)piVar3[6]);
  tcu::LogNumber<long>::write(&local_330,iVar2,__buf_05,(size_t)psVar4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d0,"StencilBits",&local_786);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f0,"Stencil bits",&local_787)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_710,glcts::fixed_sample_locations_values + 1,&local_788);
  psVar4 = &local_710;
  tcu::LogNumber<long>::LogNumber
            (&local_3a0,&local_6d0,&local_6f0,psVar4,QP_KEY_TAG_NONE,(long)piVar3[7]);
  tcu::LogNumber<long>::write(&local_3a0,iVar2,__buf_06,(size_t)psVar4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"SampleCount",&local_789);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"Sample count",&local_78a)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_770,glcts::fixed_sample_locations_values + 1,&local_78b);
  psVar4 = &local_770;
  tcu::LogNumber<long>::LogNumber
            (&local_410,&local_730,&local_750,psVar4,QP_KEY_TAG_NONE,(long)piVar3[8]);
  tcu::LogNumber<long>::write(&local_410,iVar2,__buf_07,(size_t)psVar4);
  tcu::LogNumber<long>::~LogNumber(&local_410);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::~string((string *)&local_730);
  tcu::LogNumber<long>::~LogNumber(&local_3a0);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::__cxx11::string::~string((string *)&local_6d0);
  tcu::LogNumber<long>::~LogNumber(&local_330);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_670);
  tcu::LogNumber<long>::~LogNumber(&local_2c0);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_610);
  tcu::LogNumber<long>::~LogNumber(&local_250);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_5b0);
  tcu::LogNumber<long>::~LogNumber(&local_1e0);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_550);
  tcu::LogNumber<long>::~LogNumber(&local_170);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_4f0);
  tcu::LogNumber<long>::~LogNumber(&local_100);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_490);
  tcu::LogNumber<long>::~LogNumber(&local_90);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_430);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

IterateResult iterate(void)
	{
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();

		m_testCtx.getLog() << TestLog::Integer("Width", "Width", "px", QP_KEY_TAG_NONE, renderTarget.getWidth())
						   << TestLog::Integer("Height", "Height", "px", QP_KEY_TAG_NONE, renderTarget.getHeight())
						   << TestLog::Integer("RedBits", "Red bits", "", QP_KEY_TAG_NONE, pixelFormat.redBits)
						   << TestLog::Integer("GreenBits", "Green bits", "", QP_KEY_TAG_NONE, pixelFormat.greenBits)
						   << TestLog::Integer("BlueBits", "Blue bits", "", QP_KEY_TAG_NONE, pixelFormat.blueBits)
						   << TestLog::Integer("AlphaBits", "Alpha bits", "", QP_KEY_TAG_NONE, pixelFormat.alphaBits)
						   << TestLog::Integer("DepthBits", "Depth bits", "", QP_KEY_TAG_NONE,
											   renderTarget.getDepthBits())
						   << TestLog::Integer("StencilBits", "Stencil bits", "", QP_KEY_TAG_NONE,
											   renderTarget.getStencilBits())
						   << TestLog::Integer("SampleCount", "Sample count", "", QP_KEY_TAG_NONE,
											   renderTarget.getNumSamples());

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}